

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O3

int wrapped_fxstat(int vers,int fd,stat *buf)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  code *UNRECOVERED_JUMPTABLE;
  curious_file_record_t *pcVar4;
  undefined4 local_50 [2];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  lVar3 = __tls_get_addr(&PTR_00279768);
  piVar1 = (int *)(lVar3 + 0xc);
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (code *)gotcha_get_wrappee(io_fns[0x12].handle);
  if ((*piVar1 == 1) && (wrappers_enabled != 0)) {
    pcVar4 = get_curious_file_record(fd);
    if (pcVar4 == (curious_file_record_t *)0x0) {
      local_48 = 0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
    }
    else {
      local_48 = *(undefined4 *)&pcVar4->filesystem;
      uStack_44 = *(undefined4 *)((long)&pcVar4->filesystem + 4);
      uStack_40 = *(undefined4 *)&pcVar4->mount_point;
      uStack_3c = *(undefined4 *)((long)&pcVar4->mount_point + 4);
    }
    local_50[0] = 0;
    local_38 = 0x12;
    curious_call_callbacks(4,local_50);
    iVar2 = (*UNRECOVERED_JUMPTABLE)(vers,fd,buf);
    local_50[0] = 1;
    curious_call_callbacks(5,local_50);
    *piVar1 = *piVar1 + -1;
    return iVar2;
  }
  *piVar1 = *piVar1 + -1;
  iVar2 = (*UNRECOVERED_JUMPTABLE)(vers,fd,buf);
  return iVar2;
}

Assistant:

int wrapped_fxstat(int vers, int fd, struct stat* buf)
{
    WRAPPER_ENTER(fxstat);

    // Get the handle for the original function
    fxstat_f orig_fxstat = (fxstat_f) gotcha_get_wrappee(io_fns[CURIOUS_FXSTAT_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        char*                  filesystem;
        char*                  mount_point;
        curious_file_record_t* record = get_curious_file_record(fd);
        if (NULL == record) {
            filesystem  = NULL;
            mount_point = NULL;
        } else {
            filesystem  = record->filesystem;
            mount_point = record->mount_point;
        }

        curious_metadata_record_t io_args = {
            .call_count  = 0,
            .filesystem  = filesystem,
            .mount_point = mount_point,
            .function_id = CURIOUS_FXSTAT_ID,
        };
        curious_call_callbacks(CURIOUS_METADATA_CALLBACK, &io_args);

        // Call the original, saving the result...
        int return_val     = orig_fxstat(vers, fd, buf);
        io_args.call_count = 1;

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_METADATA_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, fxstat);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_fxstat(vers, fd, buf), fxstat);
    }
}